

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_59::InMemoryFile::truncate(InMemoryFile *this,char *__file,__off_t __length)

{
  Impl *this_00;
  char *pcVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  kj::_::Mutex::lock(&(this->impl).mutex);
  this_00 = &(this->impl).value;
  pcVar1 = (char *)(this->impl).value.size;
  if (__file < pcVar1) {
    iVar2 = (**this_00->clock->_vptr_Clock)();
    (this->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar2);
    memset(__file + (long)(this->impl).value.bytes.ptr,0,(this->impl).value.size - (long)__file);
  }
  else {
    if (__file <= pcVar1) goto LAB_00463da9;
    iVar2 = (**this_00->clock->_vptr_Clock)();
    (this->impl).value.lastModified.value.value = CONCAT44(extraout_var_00,iVar2);
    Impl::ensureCapacity(this_00,(size_t)__file);
  }
  (this->impl).value.size = (size_t)__file;
LAB_00463da9:
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  return extraout_EAX;
}

Assistant:

void truncate(uint64_t newSize) const override {
    auto lock = impl.lockExclusive();
    if (newSize < lock->size) {
      lock->modified();
      memset(lock->bytes.begin() + newSize, 0, lock->size - newSize);
      lock->size = newSize;
    } else if (newSize > lock->size) {
      lock->modified();
      lock->ensureCapacity(newSize);
      lock->size = newSize;
    }
  }